

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

size_t __thiscall capnp::_::BuilderArena::sizeInWords(BuilderArena *this)

{
  MultiSegmentState *pMVar1;
  size_t sVar2;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *builder;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar3;
  
  pMVar1 = (this->moreSegments).ptr.ptr;
  if (pMVar1 == (MultiSegmentState *)0x0) {
    if ((this->segment0).super_SegmentReader.arena == (Arena *)0x0) {
      return 0;
    }
    sVar2 = (long)(this->segment0).pos - (long)(this->segment0).super_SegmentReader.ptr.ptr >> 3;
  }
  else {
    sVar2 = (long)(this->segment0).pos - (long)(this->segment0).super_SegmentReader.ptr.ptr >> 3;
    for (pOVar3 = (pMVar1->builders).builder.ptr; pOVar3 != (pMVar1->builders).builder.pos;
        pOVar3 = pOVar3 + 1) {
      sVar2 = sVar2 + ((long)pOVar3->ptr->pos - (long)(pOVar3->ptr->super_SegmentReader).ptr.ptr >>
                      3);
    }
  }
  return sVar2;
}

Assistant:

inline operator T*() { return ptr; }